

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormatSymbols::DecimalFormatSymbols(DecimalFormatSymbols *this,UErrorCode *status)

{
  UnicodeString *local_88;
  UnicodeString *local_68;
  UnicodeString *local_30;
  UErrorCode *status_local;
  DecimalFormatSymbols *this_local;
  
  memset(this,0,8);
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DecimalFormatSymbols_004e0720;
  local_30 = (UnicodeString *)&this->field_0x8;
  do {
    UnicodeString::UnicodeString(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != &this->fNoSymbol);
  UnicodeString::UnicodeString(&this->fNoSymbol);
  Locale::Locale(&this->locale);
  this->currPattern = (char16_t *)0x0;
  local_68 = (UnicodeString *)&this->field_0x978;
  do {
    UnicodeString::UnicodeString(local_68);
    local_68 = local_68 + 1;
  } while (local_68 != (UnicodeString *)&this->field_0xa38);
  local_88 = (UnicodeString *)&this->field_0xa38;
  do {
    UnicodeString::UnicodeString(local_88);
    local_88 = local_88 + 1;
  } while (local_88 != (UnicodeString *)&this->fIsCustomCurrencySymbol);
  initialize(this,&this->locale,status,'\x01',(NumberingSystem *)0x0);
  return;
}

Assistant:

DecimalFormatSymbols::DecimalFormatSymbols(UErrorCode& status)
        : UObject(), locale(), currPattern(NULL) {
    initialize(locale, status, TRUE);
}